

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

Vec_Vec_t * Saig_ManCexMinCollectFrameTerms(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  Vec_Int_t *vRoots;
  int *piVar5;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  void *pvVar8;
  uint uVar9;
  Vec_Int_t *vLeaves;
  ulong uVar10;
  uint uVar11;
  Aig_Obj_t *pObj;
  long lVar12;
  ulong uVar13;
  
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vRoots->pArray = piVar5;
  uVar1 = pCex->iFrame;
  uVar10 = (ulong)uVar1;
  uVar11 = uVar1 + 1;
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar10) {
    uVar9 = uVar11;
  }
  pVVar6->nCap = uVar9;
  if (uVar9 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)(int)uVar9 << 3);
  }
  pVVar6->pArray = ppvVar7;
  if ((int)uVar1 < 0) {
    pVVar6->nSize = uVar11;
  }
  else {
    uVar13 = 0;
    do {
      pvVar8 = calloc(1,0x10);
      ppvVar7[uVar13] = pvVar8;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
    pVVar6->nSize = uVar11;
    uVar13 = uVar10;
    if (-1 < (int)uVar1) {
      do {
        if (uVar13 == (uint)pCex->iFrame) {
          vLeaves = (Vec_Int_t *)0x0;
        }
        else {
          if ((long)uVar10 <= (long)uVar13) {
LAB_005802ca:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
          }
          vLeaves = (Vec_Int_t *)ppvVar7[uVar13 + 1];
        }
        Saig_ManCexMinGetCos(pAig,pCex,vLeaves,vRoots);
        Aig_ManIncrementTravId(pAig);
        iVar2 = vRoots->nSize;
        if (0 < (long)iVar2) {
          piVar5 = vRoots->pArray;
          lVar12 = 0;
          do {
            pVVar3 = pAig->vObjs;
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              pObj = (Aig_Obj_t *)0x0;
            }
            else {
              uVar1 = piVar5[lVar12];
              if (((int)uVar1 < 0) || (pVVar3->nSize <= (int)uVar1)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pObj = (Aig_Obj_t *)pVVar3->pArray[uVar1];
            }
            if ((long)uVar10 < (long)uVar13) goto LAB_005802ca;
            Saig_ManCexMinCollectFrameTerms_rec(pAig,pObj,(Vec_Int_t *)ppvVar7[uVar13]);
            lVar12 = lVar12 + 1;
          } while (iVar2 != lVar12);
        }
        bVar4 = 0 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar4);
      piVar5 = vRoots->pArray;
    }
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(vRoots);
  return pVVar6;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectFrameTerms( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Vec_Vec_t * vFrameCis;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // create terminals
    vRoots = Vec_IntAlloc( 1000 );
    vFrameCis = Vec_VecStart( pCex->iFrame+1 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectFrameTerms_rec( pAig, pObj, Vec_VecEntryInt(vFrameCis, f) );
    }
    Vec_IntFree( vRoots );
    return vFrameCis;
}